

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

uint8 * __thiscall
caffe::LRNParameter::InternalSerializeWithCachedSizesToArray
          (LRNParameter *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  UnknownFieldSet *unknown_fields;
  uint8 *puVar2;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 4) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                       (1,this->local_size_,target);
  }
  if ((uVar1 & 8) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteFloatToArray(2,this->alpha_,target);
  }
  if ((uVar1 & 0x10) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteFloatToArray(3,this->beta_,target);
  }
  if ((uVar1 & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (4,this->norm_region_,target);
  }
  if ((uVar1 & 0x20) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteFloatToArray(5,this->k_,target);
  }
  if ((uVar1 & 2) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray(6,this->engine_,target);
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return target;
  }
  unknown_fields = LRNParameter::unknown_fields(this);
  puVar2 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                     (unknown_fields,target);
  return puVar2;
}

Assistant:

::google::protobuf::uint8* LRNParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.LRNParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional uint32 local_size = 1 [default = 5];
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(1, this->local_size(), target);
  }

  // optional float alpha = 2 [default = 1];
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(2, this->alpha(), target);
  }

  // optional float beta = 3 [default = 0.75];
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(3, this->beta(), target);
  }

  // optional .caffe.LRNParameter.NormRegion norm_region = 4 [default = ACROSS_CHANNELS];
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      4, this->norm_region(), target);
  }

  // optional float k = 5 [default = 1];
  if (cached_has_bits & 0x00000020u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(5, this->k(), target);
  }

  // optional .caffe.LRNParameter.Engine engine = 6 [default = DEFAULT];
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      6, this->engine(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.LRNParameter)
  return target;
}